

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_wav_init_memory_write__internal
                    (ma_dr_wav *pWav,void **ppData,size_t *pDataSize,ma_dr_wav_data_format *pFormat,
                    ma_uint64 totalSampleCount,ma_bool32 isSequential,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  
  if (pDataSize != (size_t *)0x0 && ppData != (void **)0x0) {
    *ppData = (void *)0x0;
    *pDataSize = 0;
    mVar1 = ma_dr_wav_preinit_write
                      (pWav,pFormat,isSequential,ma_dr_wav__on_write_memory,
                       ma_dr_wav__on_seek_memory_write,pWav,pAllocationCallbacks);
    if (mVar1 != 0) {
      (pWav->memoryStreamWrite).ppData = ppData;
      (pWav->memoryStreamWrite).pDataSize = pDataSize;
      (pWav->memoryStreamWrite).dataSize = 0;
      (pWav->memoryStreamWrite).dataCapacity = 0;
      (pWav->memoryStreamWrite).currentWritePos = 0;
      mVar1 = ma_dr_wav_init_write__internal(pWav,pFormat,totalSampleCount);
      return mVar1;
    }
  }
  return 0;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_init_memory_write__internal(ma_dr_wav* pWav, void** ppData, size_t* pDataSize, const ma_dr_wav_data_format* pFormat, ma_uint64 totalSampleCount, ma_bool32 isSequential, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (ppData == NULL || pDataSize == NULL) {
        return MA_FALSE;
    }
    *ppData = NULL;
    *pDataSize = 0;
    if (!ma_dr_wav_preinit_write(pWav, pFormat, isSequential, ma_dr_wav__on_write_memory, ma_dr_wav__on_seek_memory_write, pWav, pAllocationCallbacks)) {
        return MA_FALSE;
    }
    pWav->memoryStreamWrite.ppData = ppData;
    pWav->memoryStreamWrite.pDataSize = pDataSize;
    pWav->memoryStreamWrite.dataSize = 0;
    pWav->memoryStreamWrite.dataCapacity = 0;
    pWav->memoryStreamWrite.currentWritePos = 0;
    return ma_dr_wav_init_write__internal(pWav, pFormat, totalSampleCount);
}